

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsNetId.cpp
# Opt level: O0

void __thiscall AmsNetId::AmsNetId(AmsNetId *this,string *addr)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  char *__nptr;
  bool local_1d9;
  ulong local_1c0;
  size_t i;
  string s;
  istringstream local_198 [8];
  istringstream iss;
  string *addr_local;
  AmsNetId *this_local;
  
  std::__cxx11::istringstream::istringstream(local_198,addr,8);
  std::__cxx11::string::string((string *)&i);
  local_1c0 = 0;
  while( true ) {
    local_1d9 = false;
    if (local_1c0 < 6) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_198,(string *)&i,'.');
      local_1d9 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    }
    if (local_1d9 == false) break;
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(__nptr);
    this->b[local_1c0] = (uint8_t)(iVar2 % 0x100);
    local_1c0 = local_1c0 + 1;
  }
  if (local_1c0 == 6) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_198,(string *)&i,'.');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) goto LAB_0019def7;
  }
  if ((AmsNetId(std::__cxx11::string_const&)::empty == '\0') &&
     (iVar2 = __cxa_guard_acquire(&AmsNetId(std::__cxx11::string_const&)::empty), iVar2 != 0)) {
    AmsNetId(&AmsNetId::empty,0);
    __cxa_guard_release(&AmsNetId(std::__cxx11::string_const&)::empty);
  }
  *(undefined4 *)this->b = AmsNetId::empty.b._0_4_;
  *(undefined2 *)(this->b + 4) = AmsNetId::empty.b._4_2_;
LAB_0019def7:
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::istringstream::~istringstream(local_198);
  return;
}

Assistant:

AmsNetId::AmsNetId(const std::string& addr)
{
    std::istringstream iss(addr);
    std::string s;
    size_t i = 0;

    while ((i < sizeof(b)) && std::getline(iss, s, '.')) {
        b[i] = atoi(s.c_str()) % 256;
        ++i;
    }

    if ((i != sizeof(b)) || std::getline(iss, s, '.')) {
        static const AmsNetId empty {};
        memcpy(b, empty.b, sizeof(b));
    }
}